

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O0

void * arena_palloc(tsdn_t *tsdn,arena_t *arena,size_t usize,size_t alignment,_Bool zero,
                   tcache_t *tcache)

{
  bool bVar1;
  byte bVar2;
  _Bool _Var3;
  uint uVar4;
  size_t x_00;
  void *pvVar5;
  ulong in_RCX;
  ulong in_RDX;
  arena_t *in_RSI;
  tsd_t *in_RDI;
  byte in_R8B;
  long in_R9;
  void *ret;
  szind_t ret_1;
  _Bool tcache_hard_success;
  size_t usize_1;
  _Bool tcache_success;
  cache_bin_t *bin;
  void *ret_2;
  size_t ret_4;
  size_t usize_3;
  _Bool tcache_success_1;
  cache_bin_t *bin_1;
  void *ret_5;
  size_t ret_10;
  void *ret_6;
  void *ret_3;
  size_t ret_7;
  size_t ret_9;
  szind_t ret_8;
  size_t usize_2;
  size_t delta_mask;
  size_t delta;
  size_t lg_delta;
  size_t x;
  size_t lg_ceil;
  size_t lg_tmin;
  undefined7 in_stack_fffffffffffffd48;
  undefined1 in_stack_fffffffffffffd4f;
  arena_t *in_stack_fffffffffffffd50;
  arena_t *in_stack_fffffffffffffd58;
  tsd_t *in_stack_fffffffffffffd60;
  arena_t *in_stack_fffffffffffffd68;
  uint local_238;
  byte local_1d9;
  size_t local_1d8;
  undefined1 local_1c9;
  int *local_1c8;
  void *local_1c0;
  byte local_1b6;
  byte local_1b5;
  uint local_1b4;
  long local_1a8;
  arena_t *local_1a0;
  tsd_t *local_198;
  uint local_184;
  tsd_t *local_180;
  size_t local_178;
  uint local_16c;
  size_t local_168;
  undefined1 local_159;
  int *local_158;
  void *local_150;
  undefined1 local_146;
  byte local_145;
  uint local_144;
  ulong local_140;
  long local_138;
  arena_t *local_130;
  tsd_t *local_128;
  uint local_114;
  tsd_t *local_110;
  ulong local_108;
  arena_t *local_100;
  size_t local_f8;
  uint local_f0;
  uint local_ec;
  void *local_e0;
  undefined1 *local_d8;
  int *local_d0;
  void *local_c8;
  void *local_c0;
  undefined1 *local_b8;
  int *local_b0;
  void *local_a8;
  long local_a0;
  tsd_t *local_98;
  long local_90;
  tsd_t *local_88;
  uint local_7c;
  arena_t *local_70;
  ulong local_68;
  arena_t *local_60;
  uint local_58;
  uint local_54;
  ulong local_50;
  arena_t *local_48;
  ulong local_40;
  long local_38;
  arena_t *local_30;
  ulong local_28;
  ulong local_20;
  ulong local_18;
  ulong local_10;
  arena_t *local_8;
  
  bVar2 = in_R8B & 1;
  if ((0x3800 < in_RDX) || ((0xfff < in_RCX && ((in_RCX != 0x1000 || ((in_RDX & 0xfff) != 0)))))) {
    if (in_RCX < 0x41) {
      pvVar5 = large_malloc((tsdn_t *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
                            (size_t)in_stack_fffffffffffffd50,(_Bool)in_stack_fffffffffffffd4f);
      return pvVar5;
    }
    pvVar5 = large_palloc((tsdn_t *)in_RDI,in_RSI,in_RDX,in_RCX,(_Bool)bVar2);
    return pvVar5;
  }
  if (in_RDX < 0x1001) {
    local_238 = (uint)sz_size2index_tab[in_RDX + 7 >> 3];
  }
  else {
    local_238 = sz_size2index_compute((size_t)in_RSI);
  }
  local_1b5 = bVar2 & 1;
  if (in_R9 != 0) {
    if (in_RDX < 0x3801) {
      local_1b4 = local_238;
      local_1b6 = 1;
      local_1d8 = 0;
      local_ec = local_238;
      local_1c8 = (int *)(in_R9 + 0x10 + (ulong)local_238 * 0x18);
      local_b8 = &local_1c9;
      local_1c8[1] = local_1c8[1] + -1;
      if ((*local_1c8 < local_1c8[1]) || (*local_1c8 = local_1c8[1], local_1c8[1] != -1)) {
        bVar1 = true;
        local_c0 = *(void **)(*(long *)(local_1c8 + 4) + (long)(local_1c8[1] + 1) * -8);
        local_a8 = local_c0;
      }
      else {
        local_1c8[1] = 0;
        bVar1 = false;
        local_a8 = (void *)0x0;
      }
      local_1c0 = local_a8;
      local_1a8 = in_R9;
      local_1a0 = in_RSI;
      local_198 = in_RDI;
      local_b0 = local_1c8;
      if (!bVar1) {
        local_1a0 = arena_choose((tsd_t *)in_stack_fffffffffffffd50,
                                 (arena_t *)
                                 CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48));
        if (local_1a0 == (arena_t *)0x0) {
          return (void *)0x0;
        }
        local_180 = local_198;
        local_1c0 = tcache_alloc_small_hard
                              ((tsdn_t *)in_RDI,in_stack_fffffffffffffd68,
                               (tcache_t *)in_stack_fffffffffffffd60,
                               (cache_bin_t *)in_stack_fffffffffffffd58,
                               (szind_t)((ulong)in_stack_fffffffffffffd50 >> 0x20),
                               (_Bool *)CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48
                                                ));
        if ((local_1d9 & 1) == 0) {
          return (void *)0x0;
        }
      }
      if (((local_1b6 & 1) != 0) || ((local_1b5 & 1) != 0)) {
        local_184 = local_1b4;
        local_16c = local_1b4;
        local_1d8 = sz_index2size_tab[local_1b4];
        local_178 = local_1d8;
      }
      if (((local_1b5 ^ 0xff) & 1) == 0) {
        if (((local_1b6 & 1) != 0) && ((opt_junk_alloc & 1U) != 0)) {
          arena_alloc_junk_small
                    (in_stack_fffffffffffffd50,
                     (bin_info_t *)CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48),
                     false);
        }
        memset(local_1c0,0,local_1d8);
      }
      else if ((local_1b6 & 1) != 0) {
        if ((opt_junk_alloc & 1U) == 0) {
          if ((opt_zero & 1U) != 0) {
            memset(local_1c0,0,local_1d8);
          }
        }
        else {
          arena_alloc_junk_small
                    (in_stack_fffffffffffffd50,
                     (bin_info_t *)CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48),
                     false);
        }
      }
      *(long *)(local_1c8 + 2) = *(long *)(local_1c8 + 2) + 1;
      local_88 = local_198;
      local_90 = local_1a8;
      _Var3 = ticker_tick((ticker_t *)0x1155f2);
      if (_Var3) {
        tcache_event_hard(in_stack_fffffffffffffd60,(tcache_t *)in_stack_fffffffffffffd58);
      }
      return local_1c0;
    }
    if (in_RDX <= tcache_maxclass) {
      local_144 = local_238;
      local_146 = 1;
      local_7c = local_238;
      local_158 = (int *)(in_R9 + 1000 + ((ulong)local_238 - 0x24) * 0x18);
      local_d8 = &local_159;
      local_158[1] = local_158[1] + -1;
      if ((*local_158 < local_158[1]) || (*local_158 = local_158[1], local_158[1] != -1)) {
        bVar1 = true;
        local_e0 = *(void **)(*(long *)(local_158 + 4) + (long)(local_158[1] + 1) * -8);
        local_c8 = local_e0;
      }
      else {
        local_158[1] = 0;
        bVar1 = false;
        local_c8 = (void *)0x0;
      }
      local_150 = local_c8;
      local_145 = local_1b5;
      local_138 = in_R9;
      local_128 = in_RDI;
      local_d0 = local_158;
      if (bVar1) {
        local_168 = sz_index2size_tab[local_238];
        local_f0 = local_238;
        local_114 = local_238;
        local_130 = in_RSI;
        local_f8 = local_168;
        if (((local_1b5 ^ 0xff) & 1) == 0) {
          memset(local_c8,0,local_168);
        }
        else if ((opt_junk_alloc & 1U) == 0) {
          if ((opt_zero & 1U) != 0) {
            memset(local_c8,0,local_168);
          }
        }
        else {
          memset(local_c8,0xa5,local_168);
        }
        *(long *)(local_158 + 2) = *(long *)(local_158 + 2) + 1;
      }
      else {
        local_140 = in_RDX;
        local_130 = arena_choose((tsd_t *)in_stack_fffffffffffffd50,
                                 (arena_t *)
                                 CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48));
        if (local_130 == (arena_t *)0x0) {
          return (void *)0x0;
        }
        local_110 = local_128;
        local_108 = local_140;
        in_stack_fffffffffffffd60 = local_128;
        if (local_140 < 0x1001) {
          local_68 = local_140;
          local_50 = local_140;
          local_58 = (uint)sz_size2index_tab[local_140 + 7 >> 3];
          local_100 = (arena_t *)sz_index2size_tab[local_58];
          local_70 = local_100;
          local_60 = local_100;
          local_54 = local_58;
        }
        else {
          local_10 = local_140;
          if (local_140 < 0x7000000000000001) {
            if (local_140 == 0) {
              local_10 = 1;
            }
            if (local_10 < 9) {
              local_18 = 3;
              x_00 = pow2_ceil_zu(0x1159c2);
              uVar4 = lg_floor(x_00);
              local_20 = (ulong)uVar4;
              if (local_20 < local_18) {
                bVar2 = (byte)local_18;
              }
              else {
                bVar2 = (byte)uVar4;
              }
              in_stack_fffffffffffffd58 = (arena_t *)(1L << (bVar2 & 0x3f));
              local_8 = in_stack_fffffffffffffd58;
            }
            else {
              uVar4 = lg_floor(local_10 * 2 - 1);
              local_28 = (ulong)uVar4;
              if (local_28 < 7) {
                in_stack_fffffffffffffd50 = (arena_t *)0x4;
              }
              else {
                in_stack_fffffffffffffd50 = (arena_t *)(local_28 - 3);
              }
              local_38 = 1L << ((byte)in_stack_fffffffffffffd50 & 0x3f);
              local_40 = local_38 - 1;
              local_48 = (arena_t *)(local_10 + local_40 & (local_40 ^ 0xffffffffffffffff));
              local_30 = in_stack_fffffffffffffd50;
              local_8 = local_48;
            }
          }
          else {
            local_8 = (arena_t *)0x0;
          }
          local_100 = local_8;
        }
        local_150 = large_malloc((tsdn_t *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
                                 (size_t)in_stack_fffffffffffffd50,(_Bool)in_stack_fffffffffffffd4f)
        ;
        if (local_150 == (void *)0x0) {
          return (void *)0x0;
        }
      }
      local_98 = local_128;
      local_a0 = local_138;
      _Var3 = ticker_tick((ticker_t *)0x115c71);
      if (_Var3) {
        tcache_event_hard(in_stack_fffffffffffffd60,(tcache_t *)in_stack_fffffffffffffd58);
      }
      return local_150;
    }
  }
  pvVar5 = arena_malloc_hard((tsdn_t *)in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,
                             CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48),0,false);
  return pvVar5;
}

Assistant:

void *
arena_palloc(tsdn_t *tsdn, arena_t *arena, size_t usize, size_t alignment,
    bool zero, tcache_t *tcache) {
	void *ret;

	if (usize <= SC_SMALL_MAXCLASS
	    && (alignment < PAGE
	    || (alignment == PAGE && (usize & PAGE_MASK) == 0))) {
		/* Small; alignment doesn't require special slab placement. */
		ret = arena_malloc(tsdn, arena, usize, sz_size2index(usize),
		    zero, tcache, true);
	} else {
		if (likely(alignment <= CACHELINE)) {
			ret = large_malloc(tsdn, arena, usize, zero);
		} else {
			ret = large_palloc(tsdn, arena, usize, alignment, zero);
		}
	}
	return ret;
}